

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,uint param_2)

{
  if (param_2 < 0x10) {
    operator<<(this,&DAT_0033f810 + *(int *)(&DAT_0033f810 + (ulong)param_2 * 4));
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Cc cc)
{
    switch (Cond(cc.raw)) {

        case Cond::BT: *this << "t";   break;
        case Cond::BF: *this << "f";   break;
        case Cond::HI: *this << "hi";  break;
        case Cond::LS: *this << "ls";  break;
        case Cond::CC: *this << "cc";  break;
        case Cond::CS: *this << "cs";  break;
        case Cond::NE: *this << "ne";  break;
        case Cond::EQ: *this << "eq";  break;
        case Cond::VC: *this << "vc";  break;
        case Cond::VS: *this << "vs";  break;
        case Cond::PL: *this << "pl";  break;
        case Cond::MI: *this << "mi";  break;
        case Cond::GE: *this << "ge";  break;
        case Cond::LT: *this << "lt";  break;
        case Cond::GT: *this << "gt";  break;
        case Cond::LE: *this << "le";  break;
    }
    return *this;
}